

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O0

vw * VW::initialize(string *s,io_buf *model,bool skipModelLoad,trace_message_t trace_listener,
                   void *trace_context)

{
  vw *argv_00;
  string *in_RDI;
  vw *ret;
  int *in_stack_00000038;
  string *in_stack_00000040;
  char **argv;
  int argc;
  string *this;
  int argc_00;
  void *in_stack_ffffffffffffff98;
  trace_message_t in_stack_ffffffffffffffa0;
  string local_58 [7];
  undefined1 in_stack_ffffffffffffffaf;
  io_buf *in_stack_ffffffffffffffb0;
  char **in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc4;
  
  this = local_58;
  std::__cxx11::string::string(this,in_RDI);
  argc_00 = (int)((ulong)this >> 0x20);
  get_argv_from_string(in_stack_00000040,in_stack_00000038);
  std::__cxx11::string::~string(local_58);
  argv_00 = initialize(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0
                       ,(bool)in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa0,
                       in_stack_ffffffffffffff98);
  free_args(argc_00,(char **)argv_00);
  return argv_00;
}

Assistant:

vw* initialize(string s, io_buf* model, bool skipModelLoad, trace_message_t trace_listener, void* trace_context)
{
  int argc = 0;
  char** argv = get_argv_from_string(s, argc);
  vw* ret = nullptr;

  try
  {
    ret = initialize(argc, argv, model, skipModelLoad, trace_listener, trace_context);
  }
  catch (...)
  {
    free_args(argc, argv);
    throw;
  }

  free_args(argc, argv);
  return ret;
}